

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O3

void work_gga_vxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double __x;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double __x_00;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double __x_01;
  double dVar102;
  double dVar103;
  double dVar104;
  double __x_02;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double __x_03;
  double dVar118;
  double dVar119;
  double __x_04;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double __x_05;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar133;
  undefined1 auVar132 [16];
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  double __x_06;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double local_f10;
  double local_ed8;
  double local_e90;
  double local_dd0;
  double local_d60;
  double local_c88;
  uint local_ad8;
  uint uStack_ad4;
  undefined8 local_ac8;
  double local_aa8;
  double local_8b8;
  double local_4d0;
  double local_4c0;
  double local_118;
  
  if (np != 0) {
    sVar9 = 0;
    local_4d0 = 0.0;
    local_e90 = 0.0;
    do {
      lVar7 = (long)(p->dim).rho * sVar9;
      dVar19 = rho[lVar7];
      if (p->nspin == 2) {
        dVar19 = dVar19 + rho[lVar7 + 1];
      }
      dVar277 = p->dens_threshold;
      if (dVar277 <= dVar19) {
        lVar8 = (long)(p->dim).sigma * sVar9;
        dVar19 = rho[lVar7];
        if (rho[lVar7] <= dVar277) {
          dVar19 = dVar277;
        }
        dVar20 = p->sigma_threshold * p->sigma_threshold;
        dVar29 = sigma[lVar8];
        if (sigma[lVar8] <= dVar20) {
          dVar29 = dVar20;
        }
        if (p->nspin == 2) {
          local_e90 = rho[lVar7 + 1];
          if (rho[lVar7 + 1] <= dVar277) {
            local_e90 = dVar277;
          }
          local_4d0 = sigma[lVar8 + 2];
          if (sigma[lVar8 + 2] <= dVar20) {
            local_4d0 = dVar20;
          }
        }
        __x_06 = dVar19 + local_e90;
        dVar134 = 1.0 / __x_06;
        dVar199 = (dVar19 + dVar19) * dVar134;
        dVar20 = p->zeta_threshold;
        dVar221 = dVar20 + -1.0;
        dVar174 = (local_e90 + local_e90) * dVar134;
        dVar249 = -dVar221;
        dVar97 = dVar19 - local_e90;
        dVar261 = dVar97 * dVar134;
        uVar10 = -(ulong)(dVar174 <= dVar20);
        uVar11 = -(ulong)(dVar199 <= dVar20);
        dVar135 = (double)(uVar11 & (ulong)dVar221 |
                          ~uVar11 & (uVar10 & (ulong)dVar249 | ~uVar10 & (ulong)dVar261)) + 1.0;
        dVar21 = cbrt(dVar20);
        dVar22 = cbrt(dVar135);
        dVar23 = cbrt(__x_06);
        dVar24 = p->cam_omega * 2.080083823051904;
        auVar173._0_8_ = cbrt(9.869604401089358);
        uVar12 = -(ulong)(1.0 - dVar261 <= dVar20);
        uVar13 = -(ulong)(dVar261 + 1.0 <= dVar20);
        dVar25 = (double)(~uVar13 & (uVar12 & (ulong)dVar249 | ~uVar12 & (ulong)dVar261) |
                         uVar13 & (ulong)dVar221) + 1.0;
        dVar26 = cbrt(dVar25);
        uVar14 = -(ulong)(dVar25 <= dVar20);
        dVar92 = (double)(uVar14 & (ulong)dVar21 | ~uVar14 & (ulong)dVar26);
        auVar173._8_8_ = dVar92;
        auVar172 = divpd(_DAT_0101f460,auVar173);
        dVar198 = auVar172._0_8_;
        dVar25 = 1.0 / dVar23;
        dVar98 = auVar172._8_8_ * dVar198 * dVar24;
        dVar27 = (dVar25 * dVar98) / 3.0;
        dVar28 = dVar198 * 3.3019272488946267;
        if (dVar29 < 0.0) {
          dVar29 = sqrt(dVar29);
        }
        else {
          dVar29 = SQRT(dVar29);
        }
        dVar30 = cbrt(dVar19);
        dVar31 = (1.0 / dVar30) / dVar19;
        dVar99 = (dVar28 * dVar29 * dVar31) / 12.0;
        dVar32 = 15.0;
        if (dVar99 <= 15.0) {
          dVar32 = dVar99;
        }
        dVar33 = dVar32;
        if (dVar32 <= 1.0) {
          dVar33 = 1.0;
        }
        dVar34 = exp(dVar33 + -8.572844);
        dVar35 = log(dVar34 + 1.0);
        uVar15 = -(ulong)(15.0 < dVar99);
        uVar16 = -(ulong)(dVar99 < 1.0);
        dVar35 = (double)(~uVar16 & (uVar15 & 0x4021254bcf0b6b6e |
                                    ~uVar15 & (ulong)(dVar33 - dVar35)) | uVar16 & (ulong)dVar99);
        dVar33 = 1e-15;
        if (1e-15 <= dVar35) {
          dVar33 = dVar35;
        }
        dVar100 = dVar33 * dVar33;
        dVar222 = dVar100 * dVar100;
        dVar175 = dVar100 * 0.00979681 + dVar222 * 0.0410834;
        dVar136 = dVar100 * dVar175;
        dVar176 = dVar100 * dVar222 * 0.0347188 +
                  dVar33 * dVar222 * 0.00120824 + dVar222 * 0.18744 + 1.0;
        dVar36 = 1.0 / dVar176;
        dVar137 = dVar136 * dVar36;
        dVar101 = 1.0 / (auVar173._0_8_ * auVar173._0_8_);
        dVar138 = 1.0 / (dVar23 * dVar23);
        dVar200 = dVar137 * 2.214317600459161;
        dVar37 = p->cam_omega * p->cam_omega;
        dVar177 = (double)(~-(ulong)(dVar27 < 14.0) & 0x4000000000000000 |
                          -(ulong)(dVar27 < 14.0) & 0x3ff74b6dffbb791d) * dVar37 *
                  1.4422495703074083;
        dVar201 = dVar92 * dVar92;
        dVar38 = 1.0 / dVar201;
        dVar139 = dVar138 * dVar101 * dVar38;
        dVar39 = dVar139 * dVar177 * 0.7381058668197203 + dVar200;
        dVar40 = xc_expint_e1_impl(dVar39,1);
        dVar41 = (dVar139 * dVar177) / 3.0;
        __x_01 = dVar137 + 0.57786348;
        dVar42 = dVar41 + __x_01;
        dVar43 = log(dVar42);
        dVar41 = dVar41 + dVar137;
        dVar44 = log(dVar41);
        dVar131 = 14.0;
        if (dVar27 <= 14.0) {
          dVar131 = dVar27;
        }
        dVar140 = dVar131 * dVar131;
        dVar102 = dVar131 * dVar140;
        dVar45 = dVar140 * dVar140;
        dVar202 = dVar131 * dVar45;
        dVar223 = dVar45 * dVar102;
        dVar103 = (dVar223 * -1.0676080470633098 +
                  dVar202 * 4.217437034869465 +
                  dVar131 * 1.7059169152930056 + dVar102 * -4.162270540644039) * 3.141592653589793;
        dVar248 = (double)(~-(ulong)(dVar131 < 14.0) & 0x4000000000000000 |
                          -(ulong)(dVar131 < 14.0) & 0x3ff74b6dffbb791d);
        dVar46 = dVar140 * dVar248;
        dVar47 = dVar46 * 2.214317600459161 + dVar200;
        if (dVar47 < 0.0) {
          dVar48 = sqrt(dVar47);
        }
        else {
          dVar48 = SQRT(dVar47);
        }
        dVar49 = xc_erfcx(dVar48);
        dVar141 = dVar140 * dVar45;
        dVar104 = dVar45 * dVar45;
        dVar50 = xc_expint_e1_impl(dVar47,1);
        __x_02 = dVar46 + __x_01;
        if (__x_02 < 0.0) {
          dVar203 = sqrt(__x_02);
        }
        else {
          dVar203 = SQRT(__x_02);
        }
        dVar142 = 1.0 / __x_02;
        dVar178 = dVar46 + dVar137;
        if (dVar178 < 0.0) {
          dVar51 = sqrt(dVar178);
        }
        else {
          dVar51 = SQRT(dVar178);
        }
        dVar52 = dVar104 * -0.20524577845574896 +
                 dVar141 * 2.723636568586566 +
                 dVar45 * -4.841839888141759 + dVar140 * 3.2686565979666846 + -1.0161144;
        dVar53 = log(dVar178 * dVar142);
        dVar105 = 1.0 / (dVar203 * __x_02);
        dVar143 = (1.0 / dVar51) * 2.478878780461809 + dVar105 * -0.5597387610403739;
        dVar144 = 1.0 / dVar178;
        dVar54 = __x_02 * __x_02;
        dVar106 = 1.0 / dVar54;
        dVar145 = dVar144 * -1.0933029406300512 + dVar106 * 0.49374260512735113;
        dVar295 = dVar203 * dVar54;
        dVar146 = dVar137 * 9.0 + dVar46 * 9.0 + -2.0322288;
        dVar308 = dVar51 * dVar178;
        dVar250 = dVar295 * 3.0;
        dVar251 = dVar250 * dVar146 + dVar308 * 4.12995389554944;
        dVar262 = __x_02 * dVar54;
        dVar224 = 1.0 / dVar262;
        dVar107 = dVar137 * 79.7154336165298 + -36.0;
        dVar301 = dVar178 * dVar178;
        dVar237 = 1.0 / dVar301;
        dVar225 = dVar224 * 0.2508588461882105 + dVar107 * 0.007715016088131 * dVar237;
        dVar108 = dVar46 * -6.0966864 + dVar301 * 27.0 + dVar137 * -6.0966864 + 4.12995389554944;
        dVar179 = 1.0 / (dVar203 * dVar262);
        dVar278 = dVar203 * dVar262 * 9.0;
        dVar147 = 1.0 / (dVar51 * dVar301);
        dVar238 = dVar51 * dVar301 * -41.96505624603882 + dVar108 * dVar278;
        dVar54 = dVar54 * dVar54;
        dVar263 = dVar178 * dVar301;
        dVar148 = dVar248 * dVar54 * 81.27826616498021;
        dVar270 = dVar46 * 329.2210656 + dVar301 * -729.0 + dVar137 * 329.2210656 +
                  -297.35668047955966;
        dVar279 = dVar54 * 0.008401793031216;
        dVar280 = dVar279 * dVar270 + dVar148 * dVar178 + dVar263 * 3.384784484376542;
        dVar302 = 1.0 / dVar295;
        dVar303 = dVar302 * dVar251;
        dVar109 = 1.0 / dVar308;
        dVar252 = dVar202 * dVar109;
        local_dd0 = dVar179 * dVar238;
        dVar309 = dVar223 * dVar147;
        dVar239 = 1.0 / dVar54;
        dVar240 = dVar239 * dVar280;
        dVar110 = 1.0 / dVar263;
        dVar296 = dVar104 * dVar110;
        dVar46 = (1.0 / dVar203) * -1.0159746228068032;
        if (dVar27 <= 14.0) {
          dVar43 = dVar53 * 0.5080572 +
                   dVar240 * 0.007566670425467926 * dVar296 +
                   local_dd0 * 0.0026165591067112575 * dVar309 +
                   dVar225 * dVar141 +
                   dVar303 * -0.09302717396924197 * dVar252 +
                   dVar145 * dVar45 +
                   dVar143 * dVar102 +
                   dVar142 * 0.738073119521991 * dVar140 +
                   dVar46 * dVar27 + (dVar103 * dVar49 * 0.5 - dVar52 * dVar50 * 0.5);
        }
        else {
          dVar43 = dVar44 * 0.5080572 + dVar40 * 0.5080572 + dVar43 * -0.5080572;
        }
        dVar264 = __x_01 * __x_01;
        dVar53 = dVar175 * 6.4753871 * dVar36 + 0.4796583;
        dVar44 = __x_01 * dVar264;
        dVar149 = (dVar53 * dVar100 + 1.0) * -0.463292766;
        dVar150 = (dVar44 * 8.1289152 + dVar264 * -1.48683344 + dVar149 * __x_01 + -0.779335965) *
                  1.7724538509055159;
        if (__x_01 < 0.0) {
          dVar55 = sqrt(__x_01);
        }
        else {
          dVar55 = SQRT(__x_01);
        }
        uVar17 = -(ulong)(dVar135 <= dVar20);
        dVar111 = dVar44 * dVar55;
        dVar317 = 1.0 / dVar111;
        dVar56 = exp(dVar200);
        if (dVar137 < 0.0) {
          dVar180 = sqrt(dVar137);
        }
        else {
          dVar180 = SQRT(dVar137);
        }
        dVar95 = (double)(~uVar17 & (ulong)(dVar22 * dVar135) | uVar17 & (ulong)(dVar20 * dVar21));
        dVar135 = erf(dVar180 * 1.4880583323442536);
        dVar135 = 1.0 - dVar135;
        dVar241 = (dVar56 * dVar135 * -2.3751029502456897 +
                  dVar150 * dVar317 * 0.0625 + 2.356194490192345) * 0.5641895835477563;
        dVar57 = (1.0 / dVar100) * dVar111;
        if (dVar33 <= 0.08) {
          dVar112 = dVar222 * 0.08534541323 + dVar100 * -0.07117647788 + -0.0262841788;
        }
        else {
          dVar112 = dVar241 * -1.0666666666666667 * dVar57;
        }
        dVar281 = dVar100 * dVar112;
        dVar113 = dVar100 * __x_01 * -0.077215461;
        dVar58 = dVar281 + dVar281 +
                 dVar113 * dVar53 +
                 ((dVar264 * -0.37170836 + -0.14853145700326428) - dVar137 * 0.077215461);
        dVar59 = dVar37 * 1.4422495703074083;
        dVar310 = dVar139 * dVar59;
        __x = dVar310 / 3.0 + __x_01;
        dVar181 = dVar100 * __x;
        dVar182 = dVar281 * 15.0 +
                  dVar53 * dVar181 * -0.463292766 +
                  dVar310 * -0.154430922 +
                  dVar137 * -0.463292766 + __x * __x * -1.48683344 + -1.0470559350195856;
        dVar288 = dVar25 * dVar182;
        if (__x < 0.0) {
          dVar60 = sqrt(__x);
        }
        else {
          dVar60 = SQRT(__x);
        }
        dVar226 = (1.0 / dVar60) / (__x * __x);
        dVar60 = p->dens_threshold;
        dVar253 = (dVar37 * p->cam_omega) / 9.869604401089358;
        dVar204 = 1.0 / (dVar92 * dVar201);
        dVar114 = dVar37 * dVar37 * p->cam_omega * 1.4422495703074083;
        dVar205 = dVar101 / 9.869604401089358;
        dVar183 = 1.0 / (dVar201 * dVar201);
        dVar184 = (dVar183 / dVar92) * dVar205 * dVar114;
        dVar206 = (1.0 / __x_01) * dVar226;
        dVar220 = dVar288 * dVar98;
        dVar242 = dVar204 * dVar253 * 0.14814814814814814;
        dVar185 = dVar184 * 0.09876543209876543;
        dVar61 = dVar23 * dVar95 * -0.36927938319101117;
        dVar115 = (double)(uVar10 & (ulong)dVar221 |
                          ~uVar10 & ((ulong)dVar249 & uVar11 | ~uVar11 & (ulong)(dVar134 * -dVar97))
                          ) + 1.0;
        dVar92 = p->zeta_threshold;
        dVar249 = cbrt(dVar115);
        dVar221 = (double)(uVar12 & (ulong)dVar221 |
                          ~uVar12 & ((~uVar13 & (ulong)dVar261 | uVar13 & (ulong)dVar221) ^
                                    0x8000000000000000)) + 1.0;
        dVar62 = cbrt(dVar221);
        uVar10 = -(ulong)(dVar221 <= dVar92);
        dVar221 = (double)((ulong)dVar21 & uVar10 | ~uVar10 & (ulong)dVar62);
        dVar151 = (1.0 / dVar221) * dVar198 * dVar24;
        dVar63 = (dVar25 * dVar151) / 3.0;
        if (local_4d0 < 0.0) {
          dVar64 = sqrt(local_4d0);
        }
        else {
          dVar64 = SQRT(local_4d0);
        }
        dVar44 = 1.0 / dVar44;
        dVar65 = cbrt(local_e90);
        dVar66 = (1.0 / dVar65) / local_e90;
        dVar116 = (dVar28 * dVar64 * dVar66) / 12.0;
        dVar67 = 15.0;
        if (dVar116 <= 15.0) {
          dVar67 = dVar116;
        }
        dVar68 = dVar67;
        if (dVar67 <= 1.0) {
          dVar68 = 1.0;
        }
        dVar69 = exp(dVar68 + -8.572844);
        dVar70 = log(dVar69 + 1.0);
        uVar12 = -(ulong)(15.0 < dVar116);
        uVar13 = -(ulong)(dVar116 < 1.0);
        dVar70 = (double)(~uVar13 & (uVar12 & 0x4021254bcf0b6b6e |
                                    ~uVar12 & (ulong)(dVar68 - dVar70)) | uVar13 & (ulong)dVar116);
        dVar68 = 1e-15;
        if (1e-15 <= dVar70) {
          dVar68 = dVar70;
        }
        dVar117 = dVar68 * dVar68;
        dVar227 = dVar117 * dVar117;
        dVar186 = dVar117 * 0.00979681 + dVar227 * 0.0410834;
        dVar152 = dVar117 * dVar186;
        dVar187 = dVar117 * dVar227 * 0.0347188 +
                  dVar68 * dVar227 * 0.00120824 + dVar227 * 0.18744 + 1.0;
        dVar71 = 1.0 / dVar187;
        dVar153 = dVar152 * dVar71;
        __x_03 = dVar153 * 2.214317600459161;
        dVar154 = (double)(~-(ulong)(dVar63 < 14.0) & 0x4000000000000000 |
                          -(ulong)(dVar63 < 14.0) & 0x3ff74b6dffbb791d) * dVar37 *
                  1.4422495703074083;
        dVar72 = dVar221 * dVar221;
        dVar118 = 1.0 / dVar72;
        dVar119 = dVar138 * dVar101 * dVar118;
        dVar73 = dVar119 * dVar154 * 0.7381058668197203 + __x_03;
        dVar74 = xc_expint_e1_impl(dVar73,1);
        dVar75 = (dVar119 * dVar154) / 3.0;
        __x_04 = dVar153 + 0.57786348;
        dVar76 = dVar75 + __x_04;
        dVar77 = log(dVar76);
        dVar75 = dVar75 + dVar153;
        dVar78 = log(dVar75);
        dVar188 = 14.0;
        if (dVar63 <= 14.0) {
          dVar188 = dVar63;
        }
        dVar155 = dVar188 * dVar188;
        dVar120 = dVar188 * dVar155;
        dVar79 = dVar155 * dVar155;
        dVar228 = dVar188 * dVar79;
        dVar207 = dVar79 * dVar120;
        dVar121 = (dVar207 * -1.0676080470633098 +
                  dVar228 * 4.217437034869465 +
                  dVar188 * 1.7059169152930056 + dVar120 * -4.162270540644039) * 3.141592653589793;
        dVar6 = (double)(~-(ulong)(dVar188 < 14.0) & 0x4000000000000000 |
                        -(ulong)(dVar188 < 14.0) & 0x3ff74b6dffbb791d);
        dVar80 = dVar155 * dVar6;
        dVar81 = dVar80 * 2.214317600459161 + __x_03;
        if (dVar81 < 0.0) {
          dVar122 = sqrt(dVar81);
        }
        else {
          dVar122 = SQRT(dVar81);
        }
        dVar137 = dVar281 * 5.0 +
                  dVar53 * dVar181 * -0.077215461 +
                  dVar310 * -0.025738487 + (-0.30439865000326427 - dVar137 * 0.077215461);
        dVar310 = dVar138 / __x_06;
        dVar82 = dVar134 * dVar242;
        dVar83 = xc_erfcx(dVar122);
        dVar156 = dVar155 * dVar79;
        dVar123 = dVar79 * dVar79;
        dVar84 = xc_expint_e1_impl(dVar81,1);
        __x_05 = dVar80 + __x_04;
        if (__x_05 < 0.0) {
          dVar208 = sqrt(__x_05);
        }
        else {
          dVar208 = SQRT(__x_05);
        }
        dVar85 = (1.0 / dVar264) * dVar226;
        dVar229 = dVar310 * (dVar281 + -0.051955731);
        dVar157 = 1.0 / __x_05;
        dVar189 = dVar80 + dVar153;
        if (dVar189 < 0.0) {
          dVar86 = sqrt(dVar189);
        }
        else {
          dVar86 = SQRT(dVar189);
        }
        dVar124 = dVar44 * dVar226;
        dVar87 = dVar123 * -0.20524577845574896 +
                 dVar156 * 2.723636568586566 +
                 dVar79 * -4.841839888141759 + dVar155 * 3.2686565979666846 + -1.0161144;
        dVar88 = log(dVar189 * dVar157);
        dVar209 = 1.0 / (dVar208 * __x_05);
        dVar158 = (1.0 / dVar86) * 2.478878780461809 + dVar209 * -0.5597387610403739;
        dVar159 = 1.0 / dVar189;
        dVar265 = __x_05 * __x_05;
        dVar125 = 1.0 / dVar265;
        dVar160 = dVar159 * -1.0933029406300512 + dVar125 * 0.49374260512735113;
        dVar318 = dVar208 * dVar265;
        dVar161 = dVar153 * 9.0 + dVar80 * 9.0 + -2.0322288;
        dVar304 = dVar86 * dVar189;
        dVar319 = dVar318 * 3.0;
        dVar320 = dVar319 * dVar161 + dVar304 * 4.12995389554944;
        dVar282 = __x_05 * dVar265;
        dVar89 = 1.0 / dVar282;
        dVar126 = dVar153 * 79.7154336165298 + -36.0;
        dVar254 = dVar189 * dVar189;
        dVar243 = 1.0 / dVar254;
        dVar90 = dVar89 * 0.2508588461882105 + dVar126 * 0.007715016088131 * dVar243;
        dVar127 = dVar80 * -6.0966864 + dVar254 * 27.0 + dVar153 * -6.0966864 + 4.12995389554944;
        dVar190 = 1.0 / (dVar208 * dVar282);
        dVar289 = dVar208 * dVar282 * 9.0;
        dVar230 = 1.0 / (dVar86 * dVar254);
        dVar244 = dVar86 * dVar254 * -41.96505624603882 + dVar127 * dVar289;
        dVar265 = dVar265 * dVar265;
        dVar290 = dVar189 * dVar254;
        dVar162 = dVar6 * dVar265 * 81.27826616498021;
        dVar255 = dVar80 * 329.2210656 + dVar254 * -729.0 + dVar153 * 329.2210656 +
                  -297.35668047955966;
        dVar311 = dVar265 * 0.008401793031216;
        dVar312 = dVar311 * dVar255 + dVar162 * dVar189 + dVar290 * 3.384784484376542;
        dVar283 = 1.0 / dVar318;
        dVar284 = dVar283 * dVar320;
        dVar191 = 1.0 / dVar304;
        dVar271 = dVar228 * dVar191;
        dVar163 = dVar190 * dVar244;
        dVar305 = dVar207 * dVar230;
        dVar231 = 1.0 / dVar265;
        dVar232 = dVar231 * dVar312;
        dVar80 = 1.0 / dVar290;
        dVar291 = dVar123 * dVar80;
        dVar245 = (1.0 / dVar208) * -1.0159746228068032;
        if (dVar63 <= 14.0) {
          local_f10 = dVar88 * 0.5080572 +
                      dVar232 * 0.007566670425467926 * dVar291 +
                      dVar163 * 0.0026165591067112575 * dVar305 +
                      dVar90 * dVar156 +
                      dVar284 * -0.09302717396924197 * dVar271 +
                      dVar160 * dVar79 +
                      dVar158 * dVar120 +
                      dVar157 * 0.738073119521991 * dVar155 +
                      dVar245 * dVar63 + (dVar121 * dVar83 * 0.5 - dVar87 * dVar84 * 0.5);
        }
        else {
          local_f10 = dVar78 * 0.5080572 + dVar74 * 0.5080572 + dVar77 * -0.5080572;
        }
        dVar210 = __x_04 * __x_04;
        dVar88 = dVar186 * 6.4753871 * dVar71 + 0.4796583;
        dVar77 = __x_04 * dVar210;
        dVar164 = (dVar88 * dVar117 + 1.0) * -0.463292766;
        dVar78 = (dVar77 * 8.1289152 + dVar210 * -1.48683344 + dVar164 * __x_04 + -0.779335965) *
                 1.7724538509055159;
        if (__x_04 < 0.0) {
          dVar91 = sqrt(__x_04);
        }
        else {
          dVar91 = SQRT(__x_04);
        }
        dVar211 = dVar229 * dVar185 * dVar124 +
                  dVar137 * dVar82 * dVar85 +
                  dVar43 * -0.8888888888888888 + dVar58 * -0.4444444444444444 * dVar44 +
                  (dVar220 * dVar206) / 27.0;
        uVar18 = -(ulong)(dVar115 <= dVar92);
        dVar43 = dVar77 * dVar91;
        dVar297 = 1.0 / dVar43;
        dVar92 = exp(__x_03);
        if (dVar153 < 0.0) {
          dVar192 = sqrt(dVar153);
        }
        else {
          dVar192 = SQRT(dVar153);
        }
        local_ac8._0_4_ = (uint)-(ulong)(dVar19 <= dVar277);
        local_ac8._4_4_ = (uint)(-(ulong)(dVar19 <= dVar277) >> 0x20);
        local_ad8 = SUB84(dVar61 * dVar211,0);
        uStack_ad4 = (uint)((ulong)(dVar61 * dVar211) >> 0x20);
        local_ac8 = (double)CONCAT44(~local_ac8._4_4_ & uStack_ad4,~(uint)local_ac8 & local_ad8);
        dVar236 = (double)(~uVar18 & (ulong)(dVar115 * dVar249) | (ulong)(dVar20 * dVar21) & uVar18)
        ;
        dVar21 = erf(dVar192 * 1.4880583323442536);
        dVar21 = 1.0 - dVar21;
        dVar128 = (dVar92 * dVar21 * -2.3751029502456897 +
                  dVar78 * dVar297 * 0.0625 + 2.356194490192345) * 0.5641895835477563;
        dVar115 = (1.0 / dVar117) * dVar43;
        if (dVar68 <= 0.08) {
          dVar193 = dVar227 * 0.08534541323 + dVar117 * -0.07117647788 + -0.0262841788;
        }
        else {
          dVar193 = dVar128 * -1.0666666666666667 * dVar115;
        }
        dVar272 = dVar117 * dVar193;
        dVar129 = dVar117 * __x_04 * -0.077215461;
        dVar93 = dVar272 + dVar272 +
                 dVar129 * dVar88 +
                 ((dVar210 * -0.37170836 + -0.14853145700326428) - dVar153 * 0.077215461);
        dVar77 = 1.0 / dVar77;
        dVar321 = dVar59 * dVar119;
        __x_00 = dVar321 / 3.0 + __x_04;
        dVar165 = dVar117 * __x_00;
        dVar166 = dVar272 * 15.0 +
                  dVar88 * dVar165 * -0.463292766 +
                  dVar321 * -0.154430922 +
                  dVar153 * -0.463292766 + __x_00 * __x_00 * -1.48683344 + -1.0470559350195856;
        dVar292 = dVar25 * dVar166;
        if (__x_00 < 0.0) {
          dVar94 = sqrt(__x_00);
        }
        else {
          dVar94 = SQRT(__x_00);
        }
        dVar306 = (1.0 / dVar94) / (__x_00 * __x_00);
        dVar94 = 1.0 / (dVar221 * dVar72);
        dVar194 = dVar272 * 5.0 +
                  dVar88 * dVar165 * -0.077215461 +
                  dVar321 * -0.025738487 + (-0.30439865000326427 - dVar153 * 0.077215461);
        dVar212 = (1.0 / dVar210) * dVar306;
        dVar167 = 1.0 / (dVar72 * dVar72);
        dVar168 = (dVar167 / dVar221) * dVar205 * dVar114;
        dVar221 = dVar310 * (dVar272 + -0.051955731);
        dVar273 = dVar77 * dVar306;
        dVar153 = dVar306 * (1.0 / __x_04);
        dVar133 = dVar292 * dVar151;
        dVar313 = dVar253 * dVar94 * 0.14814814814814814;
        dVar321 = dVar134 * dVar313;
        dVar169 = dVar168 * 0.09876543209876543;
        dVar170 = dVar169 * dVar221 * dVar273 +
                  dVar321 * dVar194 * dVar212 +
                  (dVar133 * dVar153) / 27.0 +
                  local_f10 * -0.8888888888888888 + dVar93 * -0.4444444444444444 * dVar77;
        dVar256 = dVar23 * dVar236 * -0.36927938319101117;
        local_ac8 = local_ac8 +
                    (double)(~-(ulong)(local_e90 <= dVar60) & (ulong)(dVar256 * dVar170));
        pdVar1 = out->zk;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar7 = (long)(p->dim).zk * sVar9;
          pdVar1[lVar7] = pdVar1[lVar7] + local_ac8;
        }
        dVar130 = 1.0 / (__x_06 * __x_06);
        dVar213 = dVar134 - dVar97 * dVar130;
        bVar2 = dVar20 < dVar174;
        bVar3 = dVar20 < dVar199;
        dVar199 = 0.0;
        if (bVar3 && bVar2) {
          dVar199 = dVar213;
        }
        dVar266 = (dVar28 * dVar29 * ((1.0 / dVar30) / (dVar19 * dVar19))) / -9.0;
        dVar30 = 1.0 / (dVar34 + 1.0);
        dVar195 = 0.0;
        if (dVar99 <= 15.0) {
          dVar195 = (double)(~uVar15 & (ulong)dVar266 & -(ulong)(1.0 < dVar32));
          dVar195 = dVar195 - dVar34 * dVar195 * dVar30;
        }
        bVar4 = dVar20 < 1.0 - dVar261;
        bVar5 = dVar20 < dVar261 + 1.0;
        dVar261 = 0.0;
        if (bVar5 && bVar4) {
          dVar261 = dVar213;
        }
        dVar95 = dVar95 * dVar138 * 0.9847450218426964 * dVar211 * 0.125;
        dVar293 = (double)(~-(ulong)(dVar35 < 1e-15) &
                          ((ulong)dVar266 & uVar16 | ~uVar16 & (ulong)dVar195));
        dVar285 = dVar293 * dVar36 * dVar33 * dVar175;
        dVar257 = dVar33 * dVar100;
        dVar267 = dVar293 * dVar257;
        dVar195 = dVar33 * dVar293 * 0.01959362 + dVar267 * 0.1643336;
        dVar258 = dVar100 * dVar195 * dVar36;
        dVar176 = 1.0 / (dVar176 * dVar176);
        dVar196 = dVar33 * dVar222 * 0.2083128;
        dVar197 = dVar196 * dVar293 + dVar267 * 0.74976 + dVar293 * dVar222 * 0.0060412;
        dVar274 = dVar197 * dVar176 * dVar136;
        dVar26 = 1.0 / (dVar26 * dVar26);
        dVar214 = (double)(~uVar14 & (ulong)((dVar261 * dVar26) / 3.0));
        dVar261 = dVar37 * 0.0 * 1.4422495703074083;
        dVar139 = dVar139 * dVar261;
        dVar37 = dVar139 * 0.7381058668197203;
        dVar314 = dVar138 * dVar101 * dVar204 * dVar214 * dVar177;
        dVar266 = dVar101 * dVar38 * dVar310;
        dVar215 = dVar266 * dVar177;
        dVar96 = dVar215 * 0.4920705778798135;
        dVar215 = dVar215 * 0.2222222222222222;
        local_d60 = 0.0;
        dVar259 = dVar140 * 0.0;
        dVar216 = dVar24 * dVar198;
        dVar217 = dVar25 / __x_06;
        dVar218 = (dVar217 * dVar98) / 9.0;
        if (dVar27 <= 14.0) {
          local_d60 = (dVar25 * dVar38 * dVar216 * dVar214) / -3.0 - dVar218;
        }
        dVar307 = (dVar258 * 2.214317600459161 + dVar285 * 4.428635200918322) -
                  dVar274 * 2.214317600459161;
        dVar139 = dVar139 / 3.0;
        dVar286 = (dVar285 + dVar285 + dVar258) - dVar274;
        dVar40 = dVar40 - 1.0 / dVar39;
        dVar42 = 1.0 / dVar42;
        dVar41 = 1.0 / dVar41;
        dVar308 = dVar308 * -104.91264061509705;
        dVar108 = dVar295 * dVar108 * 31.5;
        dVar52 = dVar52 * (dVar50 - 1.0 / dVar47);
        dVar104 = dVar104 * (1.0 / (dVar301 * dVar301));
        dVar295 = dVar145 * dVar102 * 4.0;
        dVar298 = dVar140 * dVar106 * -0.738073119521991;
        dVar287 = dVar131 * dVar142 * 1.476146239043982;
        dVar315 = dVar143 * dVar140 * 3.0;
        dVar225 = dVar225 * dVar202 * 6.0;
        dVar143 = (1.0 / (__x_02 * dVar54)) * dVar280 * -0.030266681701871703;
        dVar280 = dVar105 * dVar131 * 0.5079873114034016;
        dVar294 = dVar240 * -0.022700011276403777;
        dVar39 = ((1.0 / dVar203) / dVar54) * dVar238 * -0.0091579568734894;
        dVar47 = ((1.0 / dVar51) / dVar263) * dVar223;
        dVar105 = dVar147 * dVar202;
        dVar106 = dVar106 * dVar178;
        dVar263 = dVar54 * 0.0 * 81.27826616498021 * dVar178;
        dVar145 = dVar248 * dVar262 * 325.11306465992084;
        dVar301 = dVar301 * 10.154353453129625;
        dVar54 = dVar270 * dVar262 * 0.033607172124864;
        dVar238 = dVar146 * dVar203 * __x_02 * 7.5;
        dVar270 = ((dVar48 + dVar48) * dVar49 + -1.1283791670955126) * (1.0 / dVar48);
        dVar262 = dVar302 * 0.8396081415605609;
        dVar48 = dVar237 * 1.0933029406300512;
        dVar146 = dVar107 * dVar110 * -0.015430032176262;
        dVar107 = dVar251 * dVar179 * 0.23256793492310493;
        dVar203 = dVar303 * 0.13954076095386297;
        if (dVar27 <= 14.0) {
          dVar314 = dVar131 * dVar248 * local_d60;
          dVar251 = dVar314 + dVar314 + dVar259 + dVar286;
          dVar219 = dVar178 * dVar251;
          dVar233 = dVar314 * 4.428635200918322 + dVar259 * 2.214317600459161 + dVar307;
          local_c88 = dVar309 * dVar251 * dVar39 +
                      dVar223 * dVar110 * local_d60 * dVar240 * 0.060533363403743407 +
                      dVar294 * dVar104 * dVar251 +
                      dVar296 * dVar251 * dVar143 +
                      dVar49 * (dVar141 * local_d60 * -7.473256329443169 +
                               dVar45 * local_d60 * 21.087185174347326 +
                               local_d60 * 1.7059169152930056 +
                               dVar140 * local_d60 * -12.48681162193212) * 3.141592653589793 * 0.5 +
                      dVar315 * local_d60 +
                      dVar287 * local_d60 +
                      dVar251 * dVar298 +
                      dVar280 * dVar251 +
                      ((((dVar314 * -12.1933728 +
                         ((dVar274 * 6.0966864 +
                          dVar258 * -6.0966864 + dVar219 * 54.0 + dVar285 * -12.1933728) -
                         dVar259 * 6.0966864)) * dVar278 + dVar308 * dVar251 + dVar108 * dVar251) *
                        dVar179 * 0.0026165591067112575 * dVar309 + dVar295 * local_d60) -
                      dVar233 * dVar52 * 0.5) + dVar225 * local_d60 +
                      dVar141 * (dVar146 * dVar251 +
                                dVar239 * dVar251 * -0.7525765385646315 +
                                (dVar274 * -79.7154336165298 +
                                dVar285 * 159.4308672330596 + dVar258 * 79.7154336165298) *
                                0.007715016088131 * dVar237) +
                      dVar45 * (dVar48 * dVar251 + dVar224 * -0.9874852102547023 * dVar251) +
                      ((dVar46 * local_d60 +
                       (dVar109 * -1.2394393902309044 * dVar251 + dVar262 * dVar251) * dVar102 +
                       dVar270 * dVar233 * dVar103 * 0.25 +
                       (dVar51 * dVar251 * 6.19493084332416 +
                       dVar238 * dVar251 +
                       (dVar314 * 18.0 +
                       dVar274 * -9.0 + dVar285 * 18.0 + dVar258 * 9.0 + dVar259 * 9.0) * dVar250) *
                       dVar302 * -0.09302717396924197 * dVar252 +
                       ((dVar314 * 658.4421312 +
                        dVar274 * -329.2210656 +
                        dVar258 * 329.2210656 + dVar219 * -1458.0 + dVar285 * 658.4421312 +
                        dVar259 * 329.2210656) * dVar279 +
                       dVar54 * dVar251 +
                       dVar301 * dVar251 + dVar148 * dVar251 + dVar145 * dVar219 + dVar263) *
                       dVar239 * 0.007566670425467926 * dVar296 +
                       (dVar251 * dVar142 - dVar251 * dVar106) * dVar144 * 0.5080572 * __x_02 +
                       dVar105 * dVar251 * dVar203 +
                       dVar252 * dVar251 * dVar107 +
                       dVar45 * dVar109 * local_d60 * dVar303 * -0.46513586984620986 +
                       dVar141 * dVar147 * local_d60 * local_dd0 * 0.0183159137469788 +
                       dVar47 * dVar251 * local_dd0 * -0.006541397766778144) -
                      (dVar223 * -1.6419662276459916 * local_d60 +
                      dVar202 * local_d60 * 16.341819411519396 +
                      dVar27 * local_d60 * 6.537313195933369 +
                      dVar102 * local_d60 * -19.367359552567034) * dVar50 * 0.5);
        }
        else {
          dVar251 = ((dVar314 * -0.6666666666666666 + dVar139 + dVar286) - dVar215) * 0.5080572;
          local_c88 = dVar251 * dVar41 +
                      (((dVar314 * -1.4762117336394407 + dVar37 + dVar307) - dVar96) * dVar40 *
                       0.5080572 - dVar42 * dVar251);
        }
        dVar200 = exp(-dVar200);
        dVar251 = dVar175 * dVar176 * -6.4753871;
        dVar314 = dVar195 * 6.4753871 * dVar36 + dVar197 * dVar251;
        dVar111 = (1.0 / dVar257) * dVar111;
        dVar197 = (1.0 / dVar100) * dVar264 * dVar55;
        dVar195 = dVar33 * dVar53 + dVar33 * dVar53;
        dVar55 = (1.0 / dVar55) / (dVar264 * dVar264);
        dVar150 = dVar150 * -0.21875;
        dVar200 = dVar200 * dVar56 * 1.9940105822687055;
        if (dVar33 <= 0.08) {
          local_ed8 = dVar33 * dVar293 * -0.14235295576 + dVar267 * 0.34138165292;
        }
        else {
          local_ed8 = dVar241 * -3.7333333333333334 * dVar286 * dVar197 +
                      (dVar286 * (1.0 / dVar180) * dVar200 +
                      dVar307 * dVar56 * dVar135 * -2.3751029502456897 +
                      dVar286 * dVar55 * dVar150 +
                      (dVar264 * 24.3867456 * dVar286 +
                      __x_01 * dVar286 * -2.97366688 +
                      (dVar195 * dVar293 + dVar100 * dVar314) * -0.463292766 * __x_01 +
                      dVar149 * dVar286) * 1.7724538509055159 * dVar317 * 0.0625) *
                      0.5641895835477563 * -1.0666666666666667 * dVar57 +
                      dVar241 * 2.1333333333333333 * dVar293 * dVar111;
        }
        dVar275 = dVar33 * __x_01 * -0.154430922;
        dVar299 = 1.0 / (dVar264 * dVar264);
        dVar219 = (dVar182 * dVar217 * dVar98 * dVar206) / 81.0;
        dVar267 = dVar138 * dVar204 * dVar101 * dVar59;
        dVar266 = dVar266 * dVar59;
        dVar182 = dVar226 / __x;
        dVar246 = __x * -2.97366688;
        dVar307 = (1.0 / __x_01) * dVar182;
        dVar233 = (1.0 / dVar264) * dVar137;
        dVar234 = dVar242 * dVar130 * dVar137 * dVar85;
        dVar242 = dVar204 * dVar134 * dVar253;
        dVar268 = dVar138 / (__x_06 * __x_06);
        dVar269 = dVar184 * 0.1646090534979424 * (dVar281 + -0.051955731) * dVar268 * dVar124;
        dVar300 = dVar299 * dVar226;
        dVar235 = dVar44 * dVar182;
        dVar281 = dVar58 * dVar299 * 1.3333333333333333;
        dVar299 = dVar38 * dVar198 * dVar24 * dVar288;
        dVar288 = dVar98 * -0.09259259259259259 * dVar288;
        dVar316 = dVar134 * dVar183 * dVar253 * -0.4444444444444444;
        dVar58 = dVar242 * -0.2962962962962963;
        dVar242 = dVar242 * -0.37037037037037035;
        dVar183 = (dVar183 / dVar201) * dVar205 * dVar114 * -0.49382716049382713 * dVar229;
        dVar201 = dVar184 * -0.2962962962962963 * dVar229;
        dVar229 = dVar184 * -0.24691358024691357 * dVar229;
        local_118 = 0.0;
        local_4c0 = 0.0;
        if (dVar277 < dVar19) {
          dVar184 = dVar214 * dVar267;
          dVar276 = (dVar184 * -0.6666666666666666 + dVar286) - dVar266 * 0.2222222222222222;
          dVar247 = dVar100 * dVar276 * dVar53;
          dVar260 = dVar293 * dVar53 * dVar33 * __x;
          dVar171 = dVar293 * dVar112 * dVar33;
          local_ed8 = local_ed8 * dVar100;
          local_4c0 = (dVar276 * dVar235 * dVar229 +
                      dVar286 * dVar300 * dVar201 +
                      (dVar171 + dVar171 + local_ed8) * dVar310 * dVar185 * dVar124 +
                      ((dVar214 * dVar124 * dVar183 +
                       dVar276 * dVar182 * dVar233 * dVar242 +
                       dVar286 * dVar226 * dVar137 * dVar44 * dVar58 +
                       (local_ed8 * 5.0 +
                       dVar171 * 10.0 +
                       dVar181 * dVar314 * -0.077215461 +
                       dVar260 * -0.154430922 +
                       dVar247 * -0.077215461 +
                       dVar184 * 0.051476974 +
                       (dVar285 * -0.154430922 - dVar258 * 0.077215461) + dVar274 * 0.077215461 +
                       dVar266 * 0.017158991333333335) * dVar82 * dVar85 +
                       ((dVar214 * dVar226 * dVar233 * dVar316 +
                        dVar276 * dVar307 * dVar288 +
                        ((((local_ed8 * 15.0 +
                           dVar171 * 30.0 +
                           dVar181 * dVar314 * -0.463292766 +
                           dVar260 * -0.926585532 +
                           dVar247 * -0.463292766 +
                           dVar184 * 0.308861844 +
                           dVar274 * 0.463292766 +
                           dVar258 * -0.463292766 + dVar276 * dVar246 + dVar285 * -0.926585532 +
                           dVar266 * 0.102953948) * dVar25 * dVar98 * dVar206) / 27.0 +
                         (((dVar281 * dVar286 +
                           local_c88 * -0.8888888888888888 +
                           (local_ed8 + local_ed8 +
                           dVar171 * 4.0 +
                           dVar314 * dVar113 +
                           dVar293 * dVar53 * dVar275 +
                           dVar100 * dVar286 * -0.077215461 * dVar53 +
                           ((__x_01 * dVar286 * -0.74341672 + dVar285 * -0.154430922) -
                           dVar258 * 0.077215461) + dVar274 * 0.077215461) * -0.4444444444444444 *
                           dVar44) - (dVar214 * dVar206 * dVar299) / 27.0) - dVar219)) -
                        (dVar286 * dVar85 * dVar220) / 27.0)) - dVar234)) - dVar269)) * dVar61 +
                      ((double)(~uVar17 & (ulong)(dVar199 * dVar22 * 1.3333333333333333)) * dVar23 *
                       -0.36927938319101117 * dVar211 - dVar95);
        }
        dVar199 = -dVar97 * dVar130;
        if (dVar20 < dVar174) {
          local_118 = (double)(~uVar11 & (ulong)(-dVar134 - dVar199));
        }
        dVar20 = 0.0;
        dVar174 = 0.0;
        if (bVar5 && bVar4) {
          dVar174 = -dVar213;
        }
        dVar184 = dVar236 * dVar138 * 0.9847450218426964 * dVar170 * 0.125;
        dVar261 = dVar261 * dVar119;
        dVar119 = dVar261 * 0.7381058668197203;
        dVar258 = 1.0 / (dVar62 * dVar62);
        dVar285 = (double)(~uVar10 & (ulong)((dVar174 * dVar258) / 3.0));
        dVar62 = dVar138 * dVar101 * dVar94 * dVar285 * dVar154;
        dVar236 = dVar101 * dVar118 * dVar310;
        dVar213 = dVar236 * dVar154;
        dVar174 = dVar213 * 0.4920705778798135;
        dVar213 = dVar213 * 0.2222222222222222;
        dVar214 = dVar155 * 0.0;
        dVar274 = (dVar217 * dVar151) / 9.0;
        if (dVar63 <= 14.0) {
          dVar20 = (dVar25 * dVar118 * dVar216 * dVar285) / -3.0 - dVar274;
        }
        dVar261 = dVar261 / 3.0;
        dVar74 = dVar74 - 1.0 / dVar73;
        dVar76 = 1.0 / dVar76;
        dVar75 = 1.0 / dVar75;
        dVar161 = dVar161 * dVar208 * __x_05 * 7.5;
        dVar304 = dVar304 * -104.91264061509705;
        dVar314 = dVar318 * dVar127 * 31.5;
        dVar127 = -dVar189 * dVar125;
        dVar87 = dVar87 * (dVar84 - 1.0 / dVar81);
        dVar318 = ((dVar122 + dVar122) * dVar83 + -1.1283791670955126) * (1.0 / dVar122);
        dVar73 = dVar90 * dVar228 * 6.0;
        dVar209 = dVar209 * dVar188 * 0.5079873114034016;
        dVar247 = dVar125 * dVar155 * -0.738073119521991;
        dVar293 = dVar188 * dVar157 * 1.476146239043982;
        dVar171 = dVar158 * dVar155 * 3.0;
        dVar286 = dVar160 * dVar120 * 4.0;
        dVar122 = dVar320 * dVar190 * 0.23256793492310493;
        dVar320 = dVar228 * dVar230;
        dVar158 = ((1.0 / dVar86) / dVar290) * dVar207;
        dVar123 = dVar123 * (1.0 / (dVar254 * dVar254));
        local_aa8 = dVar126 * dVar80 * 0.015430032176262;
        dVar125 = dVar283 * 0.8396081415605609;
        dVar290 = dVar243 * 1.0933029406300512;
        dVar90 = dVar265 * 0.0 * 81.27826616498021 * dVar189;
        dVar126 = dVar6 * dVar282 * 325.11306465992084;
        dVar254 = dVar254 * 10.154353453129625;
        dVar255 = dVar255 * dVar282 * 0.033607172124864;
        dVar160 = dVar284 * 0.13954076095386297;
        dVar81 = ((1.0 / dVar208) / dVar265) * dVar244 * -0.0091579568734894;
        dVar282 = dVar163 * -0.006541397766778144;
        dVar208 = (1.0 / (__x_05 * dVar265)) * dVar312 * -0.030266681701871703;
        dVar244 = dVar232 * -0.022700011276403777;
        if (dVar63 <= 14.0) {
          dVar265 = dVar188 * dVar6 * dVar20;
          dVar62 = dVar265 + dVar265 + dVar214;
          dVar260 = dVar189 * dVar62;
          dVar312 = dVar265 * 4.428635200918322 + dVar214 * 2.214317600459161;
          dVar20 = dVar122 * dVar62 * dVar271 +
                   dVar312 * dVar318 * dVar121 * 0.25 +
                   dVar20 * dVar286 +
                   dVar171 * dVar20 +
                   dVar293 * dVar20 +
                   dVar247 * dVar62 +
                   dVar209 * dVar62 +
                   (((dVar127 * dVar62 + dVar157 * dVar62) * dVar159 * 0.5080572 * __x_05 +
                     dVar73 * dVar20 +
                     (dVar86 * dVar62 * 6.19493084332416 +
                     dVar161 * dVar62 + (dVar265 * 18.0 + dVar214 * 9.0) * dVar319) * dVar283 *
                     -0.09302717396924197 * dVar271 +
                     ((dVar265 * -12.1933728 + (dVar260 * 54.0 - dVar214 * 6.0966864)) * dVar289 +
                     dVar304 * dVar62 + dVar314 * dVar62) * dVar190 * 0.0026165591067112575 *
                     dVar305 +
                    (dVar156 * dVar20 * -7.473256329443169 +
                    dVar79 * dVar20 * 21.087185174347326 +
                    dVar20 * 1.7059169152930056 + dVar155 * dVar20 * -12.48681162193212) *
                    3.141592653589793 * dVar83 * 0.5) - dVar312 * dVar87 * 0.5) +
                   dVar291 * ((dVar265 * 658.4421312 + dVar260 * -1458.0 + dVar214 * 329.2210656) *
                              dVar311 +
                             dVar255 * dVar62 +
                             dVar254 * dVar62 + dVar162 * dVar62 + dVar126 * dVar260 + dVar90) *
                             dVar231 * 0.007566670425467926 +
                   (dVar290 * dVar62 + dVar89 * -0.9874852102547023 * dVar62) * dVar79 +
                   (dVar191 * -1.2394393902309044 * dVar62 + dVar125 * dVar62) * dVar120 +
                   dVar245 * dVar20 +
                   (((dVar231 * dVar62 * -0.7525765385646315 - dVar62 * local_aa8) * dVar156 +
                    dVar207 * dVar80 * dVar20 * dVar232 * 0.060533363403743407 +
                    dVar123 * dVar62 * dVar244 +
                    dVar291 * dVar62 * dVar208 +
                    dVar230 * dVar156 * dVar20 * dVar163 * 0.0183159137469788 +
                    dVar158 * dVar62 * dVar282 +
                    dVar305 * dVar62 * dVar81 +
                    (dVar320 * dVar62 * dVar160 -
                    dVar79 * dVar191 * dVar20 * dVar284 * 0.46513586984620986)) -
                   dVar84 * (dVar207 * -1.6419662276459916 * dVar20 +
                            dVar228 * dVar20 * 16.341819411519396 +
                            dVar63 * dVar20 * 6.537313195933369 +
                            dVar120 * dVar20 * -19.367359552567034) * 0.5);
        }
        else {
          dVar20 = ((dVar62 * -0.6666666666666666 + dVar261) - dVar213) * 0.5080572;
          dVar20 = dVar20 * dVar75 +
                   (((dVar62 * -1.4762117336394407 + dVar119) - dVar174) * dVar74 * 0.5080572 -
                   dVar76 * dVar20);
        }
        dVar62 = (dVar217 * dVar166 * dVar151 * dVar153) / 81.0;
        dVar166 = dVar101 * dVar59 * dVar138 * dVar94;
        dVar59 = dVar59 * dVar236;
        dVar217 = __x_00 * -2.97366688;
        dVar236 = dVar94 * dVar134 * dVar253;
        dVar260 = dVar306 / __x_00;
        dVar265 = (1.0 / __x_04) * dVar260;
        dVar312 = (1.0 / dVar210) * dVar194;
        dVar313 = dVar130 * dVar313 * dVar194 * dVar212;
        dVar276 = dVar168 * 0.1646090534979424 * dVar268 * (dVar272 + -0.051955731) * dVar273;
        dVar272 = dVar77 * dVar260;
        dVar198 = dVar24 * dVar118 * dVar198 * dVar292;
        dVar292 = dVar151 * -0.09259259259259259 * dVar292;
        dVar268 = dVar134 * dVar167 * dVar253 * -0.4444444444444444;
        dVar253 = dVar236 * -0.37037037037037035;
        dVar205 = dVar114 * dVar205 * (dVar167 / dVar72) * -0.49382716049382713 * dVar221;
        dVar24 = dVar168 * -0.24691358024691357 * dVar221;
        dVar114 = 0.0;
        if (dVar60 < local_e90) {
          dVar72 = dVar285 * dVar166;
          dVar114 = dVar72 * -0.6666666666666666 - dVar59 * 0.2222222222222222;
          dVar167 = dVar114 * dVar117 * dVar88;
          dVar114 = (dVar114 * dVar272 * dVar24 +
                    ((dVar285 * dVar273 * dVar205 +
                     dVar114 * dVar260 * dVar312 * dVar253 +
                     (dVar167 * -0.077215461 + dVar72 * 0.051476974 + dVar59 * 0.017158991333333335)
                     * dVar321 * dVar212 +
                     ((dVar285 * dVar306 * dVar312 * dVar268 +
                      dVar114 * dVar265 * dVar292 +
                      ((dVar167 * -0.463292766 +
                       dVar217 * dVar114 + dVar72 * 0.308861844 + dVar59 * 0.102953948) * dVar25 *
                       dVar151 * dVar153) / 27.0 +
                      ((dVar20 * -0.8888888888888888 + (dVar285 * dVar153 * dVar198) / -27.0) -
                      dVar62)) - dVar313)) - dVar276)) * dVar256 +
                    ((double)(~uVar18 & (ulong)(local_118 * dVar249 * 1.3333333333333333)) * dVar23
                     * -0.36927938319101117 * dVar170 - dVar184);
        }
        pdVar1 = out->vrho;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vrho * sVar9;
          pdVar1[lVar7] = (local_4c0 + dVar114) * __x_06 + local_ac8 + pdVar1[lVar7];
        }
        dVar97 = -dVar134 - dVar97 * dVar130;
        dVar20 = 0.0;
        if (bVar3 && bVar2) {
          dVar20 = dVar97;
        }
        dVar114 = 0.0;
        if (bVar5 && bVar4) {
          dVar114 = dVar97;
        }
        dVar26 = (double)(~uVar14 & (ulong)((dVar114 * dVar26) / 3.0));
        if (dVar27 <= 14.0) {
          dVar218 = (dVar25 * dVar38 * dVar216 * dVar26) / -3.0 - dVar218;
          dVar139 = dVar131 * dVar248 * dVar218;
          dVar37 = dVar139 + dVar139 + dVar259;
          dVar131 = dVar139 * 4.428635200918322 + dVar259 * 2.214317600459161;
          dVar38 = dVar37 * dVar178;
          dVar131 = dVar223 * dVar110 * dVar218 * dVar240 * 0.060533363403743407 +
                    dVar37 * dVar104 * dVar294 +
                    dVar37 * dVar296 * dVar143 +
                    local_dd0 * 0.0183159137469788 * dVar141 * dVar147 * dVar218 +
                    dVar37 * dVar47 * local_dd0 * -0.006541397766778144 +
                    dVar37 * dVar309 * dVar39 +
                    dVar303 * -0.46513586984620986 * dVar45 * dVar109 * dVar218 +
                    dVar37 * dVar105 * dVar203 +
                    dVar37 * dVar252 * dVar107 +
                    dVar270 * dVar131 * dVar103 * 0.25 +
                    (dVar37 * dVar109 * -1.2394393902309044 + dVar37 * dVar262) * dVar102 +
                    dVar46 * dVar218 +
                    ((dVar37 * dVar239 * -0.7525765385646315 + dVar37 * dVar146) * dVar141 -
                    dVar50 * (dVar223 * dVar218 * -1.6419662276459916 +
                             dVar202 * dVar218 * 16.341819411519396 +
                             dVar27 * dVar218 * 6.537313195933369 +
                             dVar218 * dVar102 * -19.367359552567034) * 0.5) +
                    dVar45 * (dVar48 * dVar37 + dVar37 * dVar224 * -0.9874852102547023) +
                    dVar37 * dVar280 +
                    (((dVar37 * dVar142 - dVar37 * dVar106) * dVar144 * 0.5080572 * __x_02 +
                      dVar225 * dVar218 +
                      ((dVar139 * 658.4421312 + dVar38 * -1458.0 + dVar259 * 329.2210656) * dVar279
                      + dVar54 * dVar37 +
                        dVar301 * dVar37 + dVar148 * dVar37 + dVar145 * dVar38 + dVar263) * dVar239
                      * 0.007566670425467926 * dVar296 +
                      ((dVar139 * -12.1933728 + (dVar38 * 54.0 - dVar259 * 6.0966864)) * dVar278 +
                      dVar308 * dVar37 + dVar37 * dVar108) * dVar179 * 0.0026165591067112575 *
                      dVar309 + (dVar51 * dVar37 * 6.19493084332416 +
                                dVar238 * dVar37 + (dVar139 * 18.0 + dVar259 * 9.0) * dVar250) *
                                dVar302 * -0.09302717396924197 * dVar252 +
                                dVar295 * dVar218 +
                                dVar315 * dVar218 + dVar298 * dVar37 + dVar287 * dVar218 +
                     (dVar218 * dVar141 * -7.473256329443169 +
                     dVar218 * dVar45 * 21.087185174347326 +
                     dVar218 * 1.7059169152930056 + dVar140 * dVar218 * -12.48681162193212) *
                     3.141592653589793 * dVar49 * 0.5) - dVar52 * dVar131 * 0.5);
        }
        else {
          dVar177 = dVar138 * dVar26 * dVar101 * dVar204 * dVar177;
          dVar131 = ((dVar177 * -0.6666666666666666 + dVar139) - dVar215) * 0.5080572;
          dVar131 = dVar131 * dVar41 +
                    (((dVar177 * -1.4762117336394407 + dVar37) - dVar96) * dVar40 * 0.5080572 -
                    dVar42 * dVar131);
        }
        local_dd0 = local_dd0 * -0.006541397766778144;
        dVar37 = 0.0;
        dVar38 = 0.0;
        if (dVar277 < dVar19) {
          dVar267 = dVar267 * dVar26;
          dVar38 = dVar267 * -0.6666666666666666 - dVar266 * 0.2222222222222222;
          dVar139 = dVar38 * dVar100 * dVar53;
          dVar38 = (dVar38 * dVar235 * dVar229 +
                   ((dVar183 * dVar26 * dVar124 +
                    dVar38 * dVar182 * dVar233 * dVar242 +
                    (dVar139 * -0.077215461 + dVar267 * 0.051476974 + dVar266 * 0.017158991333333335
                    ) * dVar82 * dVar85 +
                    ((dVar316 * dVar26 * dVar226 * dVar233 +
                     dVar38 * dVar307 * dVar288 +
                     ((dVar139 * -0.463292766 +
                      dVar266 * 0.102953948 + dVar246 * dVar38 + dVar267 * 0.308861844) * dVar25 *
                      dVar98 * dVar206) / 27.0 +
                     ((dVar131 * -0.8888888888888888 + (dVar299 * dVar26 * dVar206) / -27.0) -
                     dVar219)) - dVar234)) - dVar269)) * dVar61 +
                   ((double)(~uVar17 & (ulong)(dVar22 * 1.3333333333333333 * dVar20)) * dVar23 *
                    -0.36927938319101117 * dVar211 - dVar95);
        }
        dVar20 = 0.0;
        if (bVar3 && bVar2) {
          dVar20 = dVar134 - dVar199;
        }
        dVar134 = (dVar28 * dVar64 * ((1.0 / dVar65) / (local_e90 * local_e90))) / -9.0;
        dVar22 = 1.0 / (dVar69 + 1.0);
        dVar26 = 0.0;
        if (dVar116 <= 15.0) {
          dVar26 = (double)(~uVar12 & (ulong)dVar134 & -(ulong)(1.0 < dVar67));
          dVar26 = dVar26 - dVar69 * dVar26 * dVar22;
        }
        if (bVar5 && bVar4) {
          dVar37 = -dVar97;
        }
        dVar248 = (double)(~-(ulong)(dVar70 < 1e-15) &
                          ((ulong)dVar134 & uVar13 | ~uVar13 & (ulong)dVar26));
        dVar223 = dVar248 * dVar71 * dVar68 * dVar186;
        dVar97 = dVar68 * dVar117;
        dVar140 = dVar248 * dVar97;
        dVar139 = dVar68 * dVar248 * 0.01959362 + dVar140 * 0.1643336;
        dVar202 = dVar117 * dVar139 * dVar71;
        dVar131 = 1.0 / (dVar187 * dVar187);
        dVar177 = dVar68 * dVar227 * 0.2083128;
        dVar26 = dVar177 * dVar248 + dVar140 * 0.74976 + dVar248 * dVar227 * 0.0060412;
        dVar46 = dVar26 * dVar131 * dVar152;
        dVar199 = (dVar202 * 2.214317600459161 + dVar223 * 4.428635200918322) -
                  dVar46 * 2.214317600459161;
        dVar134 = (double)(~uVar10 & (ulong)((dVar37 * dVar258) / 3.0));
        dVar37 = (dVar223 + dVar223 + dVar202) - dVar46;
        if (dVar63 <= 14.0) {
          dVar274 = (dVar25 * dVar118 * dVar216 * dVar134) / -3.0 - dVar274;
          dVar138 = dVar188 * dVar6 * dVar274;
          dVar174 = dVar138 + dVar138 + dVar214 + dVar37;
          dVar101 = dVar189 * dVar174;
          dVar261 = dVar138 * 4.428635200918322 + dVar214 * 2.214317600459161 + dVar199;
          local_8b8 = dVar271 * (dVar86 * dVar174 * 6.19493084332416 +
                                dVar161 * dVar174 +
                                (dVar138 * 18.0 +
                                dVar214 * 9.0 + dVar46 * -9.0 + dVar223 * 18.0 + dVar202 * 9.0) *
                                dVar319) * dVar283 * -0.09302717396924197 +
                      dVar156 * ((dVar231 * dVar174 * -0.7525765385646315 +
                                 (dVar46 * -79.7154336165298 +
                                 dVar223 * 159.4308672330596 + dVar202 * 79.7154336165298) *
                                 0.007715016088131 * dVar243) - local_aa8 * dVar174) +
                      dVar79 * (dVar290 * dVar174 + dVar89 * dVar174 * -0.9874852102547023) +
                      dVar245 * dVar274 +
                      (dVar191 * dVar174 * -1.2394393902309044 + dVar125 * dVar174) * dVar120 +
                      ((((dVar320 * dVar174 * dVar160 +
                         dVar271 * dVar174 * dVar122 +
                         dVar305 * dVar174 * dVar81 +
                         ((dVar138 * 658.4421312 +
                          dVar214 * 329.2210656 +
                          dVar46 * -329.2210656 +
                          dVar202 * 329.2210656 + dVar101 * -1458.0 + dVar223 * 658.4421312) *
                          dVar311 +
                         dVar255 * dVar174 +
                         dVar254 * dVar174 + dVar162 * dVar174 + dVar126 * dVar101 + dVar90) *
                         dVar231 * 0.007566670425467926 * dVar291 +
                         dVar158 * dVar174 * dVar282 +
                         dVar230 * dVar156 * dVar274 * dVar163 * 0.0183159137469788) -
                        dVar284 * 0.46513586984620986 * dVar79 * dVar191 * dVar274) +
                       dVar121 * dVar318 * dVar261 * 0.25) -
                      dVar84 * (dVar207 * dVar274 * -1.6419662276459916 +
                               dVar228 * dVar274 * 16.341819411519396 +
                               dVar63 * dVar274 * 6.537313195933369 +
                               dVar274 * dVar120 * -19.367359552567034) * 0.5) +
                      dVar232 * 0.060533363403743407 * dVar207 * dVar80 * dVar274 +
                      dVar123 * dVar174 * dVar244 +
                      dVar291 * dVar174 * dVar208 +
                      ((dVar286 * dVar274 +
                        dVar171 * dVar274 +
                        dVar293 * dVar274 +
                        dVar174 * dVar247 +
                        ((dVar138 * -12.1933728 +
                         ((dVar46 * 6.0966864 +
                          dVar202 * -6.0966864 + dVar101 * 54.0 + dVar223 * -12.1933728) -
                         dVar214 * 6.0966864)) * dVar289 + dVar304 * dVar174 + dVar174 * dVar314) *
                        dVar190 * 0.0026165591067112575 * dVar305 +
                        dVar209 * dVar174 +
                        (dVar127 * dVar174 + dVar157 * dVar174) * dVar159 * 0.5080572 * __x_05 +
                        dVar73 * dVar274 +
                       (dVar274 * dVar156 * -7.473256329443169 +
                       dVar274 * dVar79 * 21.087185174347326 +
                       dVar274 * 1.7059169152930056 + dVar155 * dVar274 * -12.48681162193212) *
                       3.141592653589793 * dVar83 * 0.5) - dVar261 * dVar87 * 0.5);
        }
        else {
          dVar154 = dVar101 * dVar94 * dVar138 * dVar134 * dVar154;
          dVar261 = ((dVar154 * -0.6666666666666666 + dVar261 + dVar37) - dVar213) * 0.5080572;
          local_8b8 = dVar261 * dVar75 +
                      (((dVar154 * -1.4762117336394407 + dVar119 + dVar199) - dVar174) * dVar74 *
                       0.5080572 - dVar76 * dVar261);
        }
        local_aa8 = -local_aa8;
        dVar174 = exp(-__x_03);
        dVar261 = dVar186 * dVar131 * -6.4753871;
        dVar139 = dVar139 * 6.4753871 * dVar71 + dVar26 * dVar261;
        dVar43 = (1.0 / dVar97) * dVar43;
        dVar138 = (1.0 / dVar117) * dVar210 * dVar91;
        dVar101 = dVar68 * dVar88 + dVar68 * dVar88;
        dVar49 = (1.0 / dVar91) / (dVar210 * dVar210);
        dVar78 = dVar78 * -0.21875;
        dVar26 = dVar174 * dVar92 * 1.9940105822687055;
        if (dVar68 <= 0.08) {
          dVar174 = dVar68 * dVar248 * -0.14235295576 + dVar140 * 0.34138165292;
        }
        else {
          dVar174 = dVar128 * -3.7333333333333334 * dVar37 * dVar138 +
                    (dVar37 * (1.0 / dVar192) * dVar26 +
                    dVar199 * dVar92 * dVar21 * -2.3751029502456897 +
                    dVar37 * dVar49 * dVar78 +
                    (dVar210 * 24.3867456 * dVar37 +
                    __x_04 * dVar37 * -2.97366688 +
                    (dVar101 * dVar248 + dVar117 * dVar139) * -0.463292766 * __x_04 +
                    dVar164 * dVar37) * 1.7724538509055159 * dVar297 * 0.0625) * 0.5641895835477563
                    * -1.0666666666666667 * dVar115 +
                    dVar128 * 2.1333333333333333 * dVar248 * dVar43;
        }
        dVar199 = 1.0 / (dVar210 * dVar210);
        dVar50 = dVar68 * __x_04 * -0.154430922;
        dVar140 = dVar199 * dVar306;
        dVar199 = dVar93 * dVar199 * 1.3333333333333333;
        dVar236 = dVar236 * -0.2962962962962963;
        dVar221 = dVar168 * -0.2962962962962963 * dVar221;
        dVar110 = 0.0;
        if (dVar60 < local_e90) {
          dVar166 = dVar166 * dVar134;
          dVar147 = (dVar166 * -0.6666666666666666 + dVar37) - dVar59 * 0.2222222222222222;
          dVar225 = dVar117 * dVar147 * dVar88;
          dVar240 = dVar248 * dVar88 * __x_00 * dVar68;
          dVar110 = dVar248 * dVar193 * dVar68;
          dVar174 = dVar174 * dVar117;
          dVar110 = (dVar147 * dVar272 * dVar24 +
                    dVar37 * dVar140 * dVar221 +
                    (dVar110 + dVar110 + dVar174) * dVar310 * dVar169 * dVar273 +
                    ((dVar205 * dVar134 * dVar273 +
                     dVar147 * dVar260 * dVar312 * dVar253 +
                     dVar37 * dVar306 * dVar194 * dVar77 * dVar236 +
                     (dVar174 * 5.0 +
                     dVar110 * 10.0 +
                     dVar165 * dVar139 * -0.077215461 +
                     dVar240 * -0.154430922 +
                     dVar225 * -0.077215461 +
                     dVar59 * 0.017158991333333335 +
                     dVar166 * 0.051476974 +
                     (dVar223 * -0.154430922 - dVar202 * 0.077215461) + dVar46 * 0.077215461) *
                     dVar321 * dVar212 +
                     ((dVar268 * dVar134 * dVar306 * dVar312 +
                      dVar147 * dVar265 * dVar292 +
                      ((((dVar174 * 15.0 +
                         dVar110 * 30.0 +
                         dVar165 * dVar139 * -0.463292766 +
                         dVar240 * -0.926585532 +
                         dVar225 * -0.463292766 +
                         dVar59 * 0.102953948 +
                         dVar166 * 0.308861844 +
                         dVar46 * 0.463292766 +
                         dVar202 * -0.463292766 + dVar147 * dVar217 + dVar223 * -0.926585532) *
                         dVar25 * dVar151 * dVar153) / 27.0 +
                       (((dVar199 * dVar37 +
                         local_8b8 * -0.8888888888888888 +
                         (dVar174 + dVar174 +
                         dVar110 * 4.0 +
                         dVar139 * dVar129 +
                         dVar248 * dVar88 * dVar50 +
                         dVar117 * dVar37 * -0.077215461 * dVar88 +
                         ((__x_04 * dVar37 * -0.74341672 + dVar223 * -0.154430922) -
                         dVar202 * 0.077215461) + dVar46 * 0.077215461) * -0.4444444444444444 *
                         dVar77) - (dVar198 * dVar134 * dVar153) / 27.0) - dVar62)) -
                      (dVar37 * dVar212 * dVar133) / 27.0)) - dVar313)) - dVar276)) * dVar256 +
                    (dVar23 * (double)(~uVar18 & (ulong)(dVar20 * dVar249 * 1.3333333333333333)) *
                     -0.36927938319101117 * dVar170 - dVar184);
        }
        pdVar1 = out->vrho;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vrho * sVar9;
          pdVar1[lVar7 + 1] = (dVar38 + dVar110) * __x_06 + local_ac8 + pdVar1[lVar7 + 1];
        }
        dVar29 = ((1.0 / dVar29) * dVar28 * dVar31) / 24.0;
        dVar20 = 0.0;
        if (dVar99 <= 15.0) {
          dVar20 = (double)(-(ulong)(1.0 < dVar32) & (ulong)dVar29);
          dVar20 = dVar20 - dVar34 * dVar20 * dVar30;
        }
        dVar134 = (double)(~-(ulong)(dVar35 < 1e-15) &
                          (~-(ulong)(dVar99 < 1.0) & (ulong)dVar20 |
                          (ulong)dVar29 & -(ulong)(dVar99 < 1.0)));
        dVar20 = dVar33 * dVar175 * dVar36 * dVar134;
        dVar257 = dVar257 * dVar134;
        dVar249 = dVar33 * dVar134 * 0.01959362 + dVar257 * 0.1643336;
        dVar174 = dVar100 * dVar249 * dVar36;
        dVar29 = dVar196 * dVar134 + dVar257 * 0.74976 + dVar222 * dVar134 * 0.0060412;
        dVar136 = dVar136 * dVar176 * dVar29;
        dVar198 = dVar136 * -2.214317600459161 +
                  dVar20 * 4.428635200918322 + dVar174 * 2.214317600459161;
        dVar23 = (dVar20 + dVar20 + dVar174) - dVar136;
        if (dVar27 <= 14.0) {
          dVar178 = dVar178 * dVar23;
          dVar27 = dVar144 * (dVar142 * dVar23 - dVar106 * dVar23) * 0.5080572 * __x_02 +
                   dVar294 * dVar104 * dVar23 +
                   dVar143 * dVar296 * dVar23 +
                   (dVar279 * (dVar136 * -329.2210656 +
                              dVar174 * 329.2210656 + dVar178 * -1458.0 + dVar20 * 658.4421312) +
                   dVar54 * dVar23 + dVar301 * dVar23 + dVar145 * dVar178 + dVar148 * dVar23) *
                   dVar239 * 0.007566670425467926 * dVar296 +
                   dVar39 * dVar309 * dVar23 +
                   dVar179 * (dVar278 * (dVar136 * 6.0966864 +
                                        dVar174 * -6.0966864 + dVar178 * 54.0 + dVar20 * -12.1933728
                                        ) + dVar308 * dVar23 + dVar108 * dVar23) *
                   0.0026165591067112575 * dVar309 +
                   (dVar146 * dVar23 +
                   dVar239 * dVar23 * -0.7525765385646315 +
                   dVar237 * (dVar136 * -79.7154336165298 +
                             dVar20 * 159.4308672330596 + dVar174 * 79.7154336165298) *
                             0.007715016088131) * dVar141 +
                   dVar203 * dVar105 * dVar23 +
                   dVar107 * dVar252 * dVar23 +
                   dVar302 * (dVar51 * dVar23 * 6.19493084332416 +
                             dVar238 * dVar23 +
                             dVar250 * (dVar136 * -9.0 + dVar20 * 18.0 + dVar174 * 9.0)) *
                   -0.09302717396924197 * dVar252 +
                   (dVar48 * dVar23 + dVar224 * dVar23 * -0.9874852102547023) * dVar45 +
                   (dVar109 * dVar23 * -1.2394393902309044 + dVar262 * dVar23) * dVar102 +
                   dVar298 * dVar23 +
                   dVar280 * dVar23 + dVar52 * dVar198 * -0.5 + dVar103 * dVar270 * dVar198 * 0.25 +
                   local_dd0 * dVar47 * dVar23;
        }
        else {
          dVar27 = dVar23 * 0.5080572 * dVar41 +
                   (dVar40 * dVar198 * 0.5080572 - dVar42 * dVar23 * 0.5080572);
        }
        dVar29 = dVar249 * 6.4753871 * dVar36 + dVar251 * dVar29;
        if (dVar33 <= 0.08) {
          dVar135 = dVar33 * dVar134 * -0.14235295576 + dVar257 * 0.34138165292;
        }
        else {
          dVar135 = dVar241 * -3.7333333333333334 * dVar197 * dVar23 +
                    (dVar200 * (1.0 / dVar180) * dVar23 +
                    dVar56 * dVar198 * -2.3751029502456897 * dVar135 +
                    dVar150 * dVar55 * dVar23 +
                    dVar317 * (dVar264 * 24.3867456 * dVar23 +
                              __x_01 * dVar23 * -2.97366688 +
                              (dVar195 * dVar134 + dVar100 * dVar29) * -0.463292766 * __x_01 +
                              dVar149 * dVar23) * 1.7724538509055159 * 0.0625) * 0.5641895835477563
                    * -1.0666666666666667 * dVar57 +
                    dVar241 * 2.1333333333333333 * dVar111 * dVar134;
        }
        dVar198 = 0.0;
        if (dVar277 < dVar19) {
          dVar249 = dVar100 * dVar23 * dVar53;
          dVar277 = dVar112 * dVar33 * dVar134;
          dVar135 = dVar135 * dVar100;
          dVar19 = dVar249 * 0.077215461;
          dVar198 = dVar33 * __x * dVar53 * dVar134;
          auVar172._0_8_ =
               dVar206 * (dVar135 * 15.0 +
                         dVar277 * 30.0 +
                         dVar181 * dVar29 * -0.463292766 +
                         dVar198 * -0.926585532 +
                         dVar249 * -0.463292766 +
                         dVar136 * 0.463292766 +
                         dVar174 * -0.463292766 + dVar246 * dVar23 + dVar20 * -0.926585532) * dVar25
                         * dVar98;
          auVar172._8_8_ = dVar220 * dVar23 * dVar85;
          auVar173 = divpd(auVar172,_DAT_01029f10);
          dVar198 = dVar61 * (dVar229 * dVar235 * dVar23 +
                             dVar201 * dVar300 * dVar23 +
                             dVar185 * (dVar277 + dVar277 + dVar135) * dVar310 * dVar124 +
                             dVar242 * dVar233 * dVar182 * dVar23 +
                             dVar58 * dVar137 * dVar44 * dVar226 * dVar23 +
                             dVar82 * (dVar135 * 5.0 +
                                      dVar277 * 10.0 +
                                      dVar181 * dVar29 * -0.077215461 +
                                      dVar198 * -0.154430922 +
                                      (((dVar20 * -0.154430922 - dVar174 * 0.077215461) +
                                       dVar136 * 0.077215461) - dVar19)) * dVar85 +
                             dVar288 * dVar307 * dVar23 +
                             ((dVar281 * dVar23 +
                               dVar27 * -0.8888888888888888 +
                               dVar44 * (dVar135 + dVar135 +
                                        dVar277 * 4.0 +
                                        dVar113 * dVar29 +
                                        dVar275 * dVar53 * dVar134 +
                                        ((((__x_01 * dVar23 * -0.74341672 + dVar20 * -0.154430922) -
                                          dVar174 * 0.077215461) + dVar136 * 0.077215461) - dVar19))
                                        * -0.4444444444444444 + auVar173._0_8_) - auVar173._8_8_));
        }
        pdVar1 = out->vsigma;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vsigma * sVar9;
          dVar19 = (pdVar1 + lVar7)[1];
          pdVar1[lVar7] = dVar198 * __x_06 + pdVar1[lVar7];
          (pdVar1 + lVar7)[1] = dVar19 + 0.0;
        }
        dVar277 = (dVar28 * (1.0 / dVar64) * dVar66) / 24.0;
        dVar19 = 0.0;
        if (dVar116 <= 15.0) {
          dVar19 = (double)(-(ulong)(1.0 < dVar67) & (ulong)dVar277);
          dVar19 = dVar19 - dVar69 * dVar19 * dVar22;
        }
        dVar277 = (double)(~-(ulong)(dVar70 < 1e-15) &
                          (~-(ulong)(dVar116 < 1.0) & (ulong)dVar19 |
                          (ulong)dVar277 & -(ulong)(dVar116 < 1.0)));
        dVar19 = dVar68 * dVar186 * dVar71 * dVar277;
        dVar97 = dVar97 * dVar277;
        dVar20 = dVar68 * dVar277 * 0.01959362 + dVar97 * 0.1643336;
        dVar22 = dVar117 * dVar20 * dVar71;
        dVar27 = dVar177 * dVar277 + dVar97 * 0.74976 + dVar227 * dVar277 * 0.0060412;
        dVar152 = dVar152 * dVar131 * dVar27;
        dVar23 = dVar152 * -2.214317600459161 +
                 dVar19 * 4.428635200918322 + dVar22 * 2.214317600459161;
        dVar29 = (dVar19 + dVar19 + dVar22) - dVar152;
        if (dVar63 <= 14.0) {
          dVar189 = dVar189 * dVar29;
          dVar28 = dVar159 * (dVar127 * dVar29 + dVar157 * dVar29) * 0.5080572 * __x_05 +
                   dVar244 * dVar123 * dVar29 +
                   dVar208 * dVar291 * dVar29 +
                   (dVar311 * (dVar152 * -329.2210656 +
                              dVar22 * 329.2210656 + dVar189 * -1458.0 + dVar19 * 658.4421312) +
                   dVar255 * dVar29 + dVar254 * dVar29 + dVar126 * dVar189 + dVar162 * dVar29) *
                   dVar231 * 0.007566670425467926 * dVar291 +
                   dVar282 * dVar158 * dVar29 +
                   dVar81 * dVar305 * dVar29 +
                   dVar190 * (dVar289 * (dVar152 * 6.0966864 +
                                        dVar22 * -6.0966864 + dVar189 * 54.0 + dVar19 * -12.1933728)
                             + dVar304 * dVar29 + dVar314 * dVar29) * 0.0026165591067112575 *
                   dVar305 + (local_aa8 * dVar29 +
                             dVar231 * dVar29 * -0.7525765385646315 +
                             dVar243 * (dVar152 * -79.7154336165298 +
                                       dVar19 * 159.4308672330596 + dVar22 * 79.7154336165298) *
                                       0.007715016088131) * dVar156 +
                             dVar160 * dVar320 * dVar29 +
                             dVar122 * dVar271 * dVar29 +
                             dVar283 * (dVar86 * dVar29 * 6.19493084332416 +
                                       dVar161 * dVar29 +
                                       dVar319 * (dVar152 * -9.0 + dVar19 * 18.0 + dVar22 * 9.0)) *
                             -0.09302717396924197 * dVar271 +
                             (dVar290 * dVar29 + dVar89 * dVar29 * -0.9874852102547023) * dVar79 +
                             (dVar191 * dVar29 * -1.2394393902309044 + dVar125 * dVar29) * dVar120 +
                             dVar247 * dVar29 +
                             dVar209 * dVar29 +
                             dVar87 * dVar23 * -0.5 + dVar121 * dVar318 * dVar23 * 0.25;
        }
        else {
          dVar28 = dVar29 * 0.5080572 * dVar75 +
                   (dVar74 * dVar23 * 0.5080572 - dVar76 * dVar29 * 0.5080572);
        }
        dVar20 = dVar20 * 6.4753871 * dVar71 + dVar261 * dVar27;
        if (dVar68 <= 0.08) {
          dVar21 = dVar68 * dVar277 * -0.14235295576 + dVar97 * 0.34138165292;
        }
        else {
          dVar21 = dVar128 * -3.7333333333333334 * dVar138 * dVar29 +
                   (dVar26 * (1.0 / dVar192) * dVar29 +
                   dVar92 * dVar23 * -2.3751029502456897 * dVar21 +
                   dVar78 * dVar49 * dVar29 +
                   dVar297 * (dVar210 * 24.3867456 * dVar29 +
                             __x_04 * dVar29 * -2.97366688 +
                             (dVar101 * dVar277 + dVar117 * dVar20) * -0.463292766 * __x_04 +
                             dVar164 * dVar29) * 1.7724538509055159 * 0.0625) * 0.5641895835477563 *
                   -1.0666666666666667 * dVar115 + dVar128 * 2.1333333333333333 * dVar43 * dVar277;
        }
        dVar23 = 0.0;
        if (dVar60 < local_e90) {
          dVar23 = dVar117 * dVar29 * dVar88;
          dVar27 = dVar193 * dVar68 * dVar277;
          dVar21 = dVar21 * dVar117;
          dVar26 = dVar23 * 0.077215461;
          dVar97 = __x_00 * dVar68 * dVar88 * dVar277;
          auVar132._0_8_ =
               dVar153 * dVar25 * (dVar21 * 15.0 +
                                  dVar27 * 30.0 +
                                  dVar165 * dVar20 * -0.463292766 +
                                  dVar97 * -0.926585532 +
                                  dVar23 * -0.463292766 +
                                  dVar152 * 0.463292766 +
                                  dVar22 * -0.463292766 + dVar217 * dVar29 + dVar19 * -0.926585532)
                         * dVar151;
          auVar132._8_8_ = dVar133 * dVar29 * dVar212;
          auVar173 = divpd(auVar132,_DAT_01029f10);
          dVar23 = dVar256 * (dVar24 * dVar272 * dVar29 +
                             dVar221 * dVar140 * dVar29 +
                             dVar169 * dVar310 * (dVar27 + dVar27 + dVar21) * dVar273 +
                             dVar253 * dVar312 * dVar260 * dVar29 +
                             dVar236 * dVar194 * dVar77 * dVar306 * dVar29 +
                             dVar321 * (dVar21 * 5.0 +
                                       dVar27 * 10.0 +
                                       dVar165 * dVar20 * -0.077215461 +
                                       dVar97 * -0.154430922 +
                                       (((dVar19 * -0.154430922 - dVar22 * 0.077215461) +
                                        dVar152 * 0.077215461) - dVar26)) * dVar212 +
                             dVar292 * dVar265 * dVar29 +
                             ((dVar199 * dVar29 +
                               dVar28 * -0.8888888888888888 +
                               dVar77 * (dVar21 + dVar21 +
                                        dVar27 * 4.0 +
                                        dVar129 * dVar20 +
                                        dVar50 * dVar88 * dVar277 +
                                        ((((__x_04 * dVar29 * -0.74341672 + dVar19 * -0.154430922) -
                                          dVar22 * 0.077215461) + dVar152 * 0.077215461) - dVar26))
                                        * -0.4444444444444444 + auVar173._0_8_) - auVar173._8_8_));
        }
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vsigma * sVar9;
          pdVar1[lVar7 + 2] = __x_06 * dVar23 + pdVar1[lVar7 + 2];
        }
      }
      sVar9 = sVar9 + 1;
    } while (np != sVar9);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}